

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void textui_browse_knowledge(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  undefined1 local_24 [8];
  region_conflict knowledge_region;
  wchar_t rune_max;
  wchar_t flag;
  wchar_t i;
  
  knowledge_region.width = max_runes();
  local_24._0_4_ = 0;
  local_24._4_4_ = 0;
  knowledge_region.col = L'\xffffffff';
  knowledge_region.row = main_knowledge_menu.count + L'\x02';
  if (main_knowledge_menu.irune < main_knowledge_menu.count) {
    knowledge_region.page_rows = L'\x01';
    for (rune_max = L'\0'; rune_max < knowledge_region.width; rune_max = rune_max + L'\x01') {
      _Var1 = player_knows_rune(player,(long)rune_max);
      if ((_Var1) || (((player->opts).opt[0x1a] & 1U) != 0)) {
        knowledge_region.page_rows = L'\0';
        break;
      }
    }
    main_knowledge_menu.actions[main_knowledge_menu.irune].flags = knowledge_region.page_rows;
  }
  if (main_knowledge_menu.iartifact < main_knowledge_menu.count) {
    wVar2 = collect_known_artifacts((int *)0x0,0);
    main_knowledge_menu.actions[main_knowledge_menu.iartifact].flags = (uint)(wVar2 < L'\x01');
  }
  if (main_knowledge_menu.iego < main_knowledge_menu.count) {
    knowledge_region.page_rows = L'\x01';
    for (rune_max = L'\0'; rune_max < (int)(uint)z_info->e_max; rune_max = rune_max + L'\x01') {
      if (((e_info[rune_max].everseen & 1U) != 0) || (((player->opts).opt[0x1a] & 1U) != 0)) {
        knowledge_region.page_rows = L'\0';
        break;
      }
    }
    main_knowledge_menu.actions[main_knowledge_menu.iego].flags = knowledge_region.page_rows;
  }
  if (main_knowledge_menu.imonster < main_knowledge_menu.count) {
    wVar2 = count_known_monsters();
    main_knowledge_menu.actions[main_knowledge_menu.imonster].flags = (uint)(wVar2 < L'\x01');
  }
  if (main_knowledge_menu.ishape < main_knowledge_menu.count) {
    wVar2 = count_interesting_shapes();
    main_knowledge_menu.actions[main_knowledge_menu.ishape].flags = (uint)(wVar2 < L'\x01');
  }
  screen_save();
  menu_layout((menu *)&main_knowledge_menu.m,(region *)local_24);
  clear_from(L'\0');
  menu_select((menu *)&main_knowledge_menu.m,0,false);
  screen_load();
  return;
}

Assistant:

void textui_browse_knowledge(void)
{
	int i, flag, rune_max = max_runes();
	region knowledge_region = { 0, 0, -1, 2 + main_knowledge_menu.count };

	/* Runes */
	if (main_knowledge_menu.irune < main_knowledge_menu.count) {
		flag = MN_ACT_GRAYED;
		for (i = 0; i < rune_max; i++) {
			if (player_knows_rune(player, i)
					|| OPT(player, cheat_xtra)) {
				flag = 0;
				break;
			}
		}
		main_knowledge_menu.actions[main_knowledge_menu.irune].flags =
			flag;
	}
		
	/* Artifacts */
	if (main_knowledge_menu.iartifact < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.iartifact].flags =
			(collect_known_artifacts(NULL, 0) > 0) ?
			0 : MN_ACT_GRAYED;
	}

	/* Ego items */
	if (main_knowledge_menu.iego < main_knowledge_menu.count) {
		flag = MN_ACT_GRAYED;
		for (i = 0; i < z_info->e_max; i++) {
			if (e_info[i].everseen || OPT(player, cheat_xtra)) {
				flag = 0;
				break;
			}
		}
		main_knowledge_menu.actions[main_knowledge_menu.iego].flags = flag;
	}

	/* Monsters */
	if (main_knowledge_menu.imonster < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.imonster].flags =
			(count_known_monsters() > 0) ? 0 : MN_ACT_GRAYED;
	}

	/* Shapechanges */
	if (main_knowledge_menu.ishape < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.ishape].flags =
			(count_interesting_shapes() > 0) ? 0 : MN_ACT_GRAYED;
	}

	screen_save();
	menu_layout(&main_knowledge_menu.m, &knowledge_region);

	clear_from(0);
	menu_select(&main_knowledge_menu.m, 0, false);

	screen_load();
}